

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void cm_zlib__tr_init(deflate_state *s)

{
  long lVar1;
  
  (s->l_desc).dyn_tree = s->dyn_ltree;
  (s->l_desc).stat_desc = &static_l_desc;
  (s->d_desc).dyn_tree = s->dyn_dtree;
  (s->d_desc).stat_desc = &static_d_desc;
  (s->bl_desc).dyn_tree = s->bl_tree;
  (s->bl_desc).stat_desc = &static_bl_desc;
  s->bi_buf = 0;
  s->bi_valid = 0;
  lVar1 = 0x35;
  do {
    *(undefined2 *)((long)&s->strm + lVar1 * 4) = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x153);
  lVar1 = 0;
  do {
    s->dyn_dtree[lVar1].fc.freq = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x1e);
  lVar1 = 0;
  do {
    s->bl_tree[lVar1].fc.freq = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x13);
  s->dyn_ltree[0x100].fc.freq = 1;
  s->sym_next = 0;
  s->opt_len = 0;
  s->static_len = 0;
  s->matches = 0;
  return;
}

Assistant:

void ZLIB_INTERNAL _tr_init(deflate_state *s) {
    tr_static_init();

    s->l_desc.dyn_tree = s->dyn_ltree;
    s->l_desc.stat_desc = &static_l_desc;

    s->d_desc.dyn_tree = s->dyn_dtree;
    s->d_desc.stat_desc = &static_d_desc;

    s->bl_desc.dyn_tree = s->bl_tree;
    s->bl_desc.stat_desc = &static_bl_desc;

    s->bi_buf = 0;
    s->bi_valid = 0;
#ifdef ZLIB_DEBUG
    s->compressed_len = 0L;
    s->bits_sent = 0L;
#endif

    /* Initialize the first block of the first file: */
    init_block(s);
}